

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.c
# Opt level: O0

void calc_scalar(rt_function_t *f,float value,_func_float_float_float *calc_func)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  float fVar4;
  rt_list_t shape;
  int local_3c;
  int i;
  float *output;
  float *input;
  int out_size;
  _func_float_float_float *calc_func_local;
  float value_local;
  rt_function_t *f_local;
  
  shape._4_4_ = 0;
  shape.size = ((*f->outputs)->shape).size;
  shape.data = ((*f->outputs)->shape).data;
  iVar3 = calc_shape_size(shape);
  pvVar1 = (*f->inputs)->data;
  pvVar2 = (*f->outputs)->data;
  for (local_3c = 0; local_3c < iVar3; local_3c = local_3c + 1) {
    fVar4 = (*calc_func)(*(float *)((long)pvVar1 + (long)local_3c * 4),value);
    *(float *)((long)pvVar2 + (long)local_3c * 4) = fVar4;
  }
  return;
}

Assistant:

void calc_scalar(rt_function_t *f, float value,
                 float (*calc_func)(float, float)) {
  int out_size = calc_shape_size(f->outputs[0]->shape);
  float *input = f->inputs[0]->data;
  float *output = f->outputs[0]->data;
  int i; // Iterator
  for (i = 0; i < out_size; i++) {
    output[i] = calc_func(input[i], value);
  }
}